

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_trace_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [24];
  undefined1 auVar2 [32];
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [32];
  __m256i alVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  parasail_result_t *ppVar16;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  __m256i *palVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined8 uVar44;
  uint a;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  __m256i_64_t e;
  __m256i_64_t h;
  int local_2d8;
  int local_250;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar82 [64];
  undefined1 auVar104 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_trace_scan_profile_avx2_256_64_cold_1();
        }
        else {
          iVar13 = uVar3 - 1;
          uVar45 = (ulong)uVar3 + 3 >> 2;
          a = (uint)uVar45;
          iVar14 = iVar13 / (int)a;
          uVar27 = CONCAT44(0,open);
          iVar19 = -open;
          iVar15 = ppVar5->min;
          uVar40 = 0x8000000000000000 - (long)iVar15;
          if (iVar15 != iVar19 && SBORROW4(iVar15,iVar19) == iVar15 + open < 0) {
            uVar40 = uVar27 | 0x8000000000000000;
          }
          iVar15 = ppVar5->max;
          ppVar16 = parasail_result_new_trace(a,s2Len,0x20,0x20);
          if (ppVar16 != (parasail_result_t *)0x0) {
            ppVar16->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x4880402;
            ptr = parasail_memalign___m256i(0x20,uVar45);
            ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,uVar45);
            ptr_02 = parasail_memalign___m256i(0x20,uVar45);
            ptr_03 = parasail_memalign___m256i(0x20,uVar45);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar20 = s2Len + -1;
              iVar21 = 3 - iVar14;
              auVar62._8_4_ = open;
              auVar62._0_8_ = uVar27;
              auVar62._12_4_ = 0;
              auVar62._16_4_ = open;
              auVar62._20_4_ = 0;
              auVar62._24_4_ = open;
              auVar62._28_4_ = 0;
              auVar79 = ZEXT3264(auVar62);
              uVar37 = CONCAT44(0,gap);
              auVar80._8_4_ = gap;
              auVar80._0_8_ = uVar37;
              auVar80._12_4_ = 0;
              auVar80._16_4_ = gap;
              auVar80._20_4_ = 0;
              auVar80._24_4_ = gap;
              auVar80._28_4_ = 0;
              auVar82 = ZEXT3264(auVar80);
              uVar40 = uVar40 + 1;
              lVar30 = 0x7ffffffffffffffe - (long)iVar15;
              auVar112._8_8_ = lVar30;
              auVar112._0_8_ = lVar30;
              auVar112._16_8_ = lVar30;
              auVar112._24_8_ = lVar30;
              lVar30 = (long)(int)-(a * gap);
              auVar74._8_8_ = lVar30;
              auVar74._0_8_ = lVar30;
              auVar74._16_8_ = lVar30;
              auVar74._24_8_ = lVar30;
              auVar74 = vpblendd_avx2(auVar74,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar74 = vpaddq_avx2(ZEXT832(uVar40),auVar74);
              lVar30 = (long)iVar19;
              uVar31 = 0;
              do {
                lVar36 = 0;
                lVar34 = lVar30;
                do {
                  lVar25 = lVar34;
                  if (s1_beg != 0) {
                    lVar25 = 0;
                  }
                  local_80[lVar36] = lVar25;
                  local_a0[lVar36] = lVar25 - uVar27;
                  lVar36 = lVar36 + 1;
                  lVar34 = lVar34 - uVar45 * uVar37;
                } while (lVar36 != 4);
                palVar22 = ptr_02 + uVar31;
                (*palVar22)[0] = local_80[0];
                (*palVar22)[1] = local_80[1];
                (*palVar22)[2] = local_80[2];
                (*palVar22)[3] = local_80[3];
                palVar22 = ptr + uVar31;
                (*palVar22)[0] = local_a0[0];
                (*palVar22)[1] = local_a0[1];
                (*palVar22)[2] = local_a0[2];
                (*palVar22)[3] = local_a0[3];
                uVar31 = uVar31 + 1;
                lVar30 = lVar30 - uVar37;
              } while (uVar31 != uVar45);
              *ptr_00 = 0;
              uVar27 = 1;
              do {
                iVar15 = 0;
                if (s2_beg == 0) {
                  iVar15 = iVar19;
                }
                ptr_00[uVar27] = (long)iVar15;
                uVar27 = uVar27 + 1;
                iVar19 = iVar19 - gap;
              } while (s2Len + 1 != uVar27);
              alVar8 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar62);
              palVar22 = ptr_03 + (a - 1);
              uVar27 = uVar45;
              auVar77 = ZEXT3264(auVar112);
              do {
                *palVar22 = alVar8;
                alVar8 = (__m256i)vpsubq_avx2((undefined1  [32])alVar8,auVar80);
                uVar31 = alVar8[0];
                if ((long)auVar77._0_8_ < (long)alVar8[0]) {
                  uVar31 = auVar77._0_8_;
                }
                uVar32 = vpextrq_avx(auVar77._0_16_,1);
                uVar37 = vpextrq_avx(alVar8._0_16_,1);
                if ((long)uVar32 < (long)uVar37) {
                  uVar37 = uVar32;
                }
                uVar32 = alVar8[2];
                if ((long)auVar77._16_8_ < (long)alVar8[2]) {
                  uVar32 = auVar77._16_8_;
                }
                uVar33 = vpextrq_avx(auVar77._16_16_,1);
                uVar41 = vpextrq_avx(alVar8._16_16_,1);
                if ((long)uVar33 < (long)uVar41) {
                  uVar41 = uVar33;
                }
                auVar49._8_8_ = 0;
                auVar49._0_8_ = uVar41;
                auVar93._8_8_ = 0;
                auVar93._0_8_ = uVar32;
                auVar49 = vpunpcklqdq_avx(auVar93,auVar49);
                auVar94._8_8_ = 0;
                auVar94._0_8_ = uVar37;
                auVar106._8_8_ = 0;
                auVar106._0_8_ = uVar31;
                auVar93 = vpunpcklqdq_avx(auVar106,auVar94);
                auVar114._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar93;
                auVar114._32_32_ = auVar77._32_32_;
                auVar114._16_16_ = ZEXT116(1) * auVar49;
                palVar22 = palVar22 + -1;
                iVar15 = (int)uVar27;
                uVar26 = iVar15 - 1;
                uVar27 = (ulong)uVar26;
                auVar77 = auVar114;
              } while (uVar26 != 0 && 0 < iVar15);
              palVar22 = ptr_02 + (uint)(iVar13 % (int)a);
              uVar27 = 1;
              if (1 < s2Len) {
                uVar27 = (ulong)(uint)s2Len;
              }
              lVar34 = (ulong)(a + (a == 0)) << 5;
              lVar30 = 0;
              auVar127 = ZEXT3264(CONCAT824(8,CONCAT816(8,CONCAT88(8,8))));
              auVar128 = ZEXT3264(CONCAT824(0x10,CONCAT816(0x10,CONCAT88(0x10,0x10))));
              auVar7._8_8_ = uVar40;
              auVar7._0_8_ = uVar40;
              auVar7._16_8_ = uVar40;
              auVar7._24_8_ = uVar40;
              auVar109 = ZEXT3264(auVar7);
              auVar77 = ZEXT3264(auVar7);
              uVar31 = 0;
              local_2d8 = iVar20;
              do {
                alVar8 = ptr_02[a - 1];
                auVar49 = alVar8._0_16_;
                auVar75._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar49;
                auVar75._16_16_ = ZEXT116(0) * alVar8._16_16_ + ZEXT116(1) * auVar49;
                auVar62 = vpalignr_avx2((undefined1  [32])alVar8,auVar75,8);
                auVar62 = vpblendd_avx2(auVar62,ZEXT832((ulong)ptr_00[uVar31]),3);
                iVar15 = ppVar5->mapper[(byte)s2[uVar31]];
                auVar56._8_8_ = uVar40;
                auVar56._0_8_ = uVar40;
                auVar56._16_8_ = uVar40;
                auVar56._24_8_ = uVar40;
                auVar80 = vpsubq_avx2(auVar56,(undefined1  [32])*ptr_03);
                lVar36 = 0;
                do {
                  auVar75 = vpaddq_avx2(auVar62,*(undefined1 (*) [32])
                                                 ((long)pvVar4 +
                                                 lVar36 + (long)iVar15 * uVar45 * 0x20));
                  auVar62 = *(undefined1 (*) [32])((long)*ptr_02 + lVar36);
                  auVar78 = auVar79._0_32_;
                  auVar76 = vpsubq_avx2(auVar62,auVar78);
                  auVar81 = auVar82._0_32_;
                  auVar104 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar36),auVar81);
                  auVar7 = vpcmpgtq_avx2(auVar76,auVar104);
                  auVar7 = vblendvpd_avx(auVar128._0_32_,auVar127._0_32_,auVar7);
                  auVar80 = vpaddq_avx2(auVar80,*(undefined1 (*) [32])((long)*ptr_03 + lVar36));
                  *(undefined1 (*) [32])
                   ((long)((ppVar16->field_4).rowcols)->score_row + lVar36 + lVar30) = auVar7;
                  uVar37 = auVar104._0_8_;
                  if ((long)auVar104._0_8_ < (long)auVar76._0_8_) {
                    uVar37 = auVar76._0_8_;
                  }
                  uVar41 = vpextrq_avx(auVar76._0_16_,1);
                  uVar32 = vpextrq_avx(auVar104._0_16_,1);
                  if ((long)uVar32 < (long)uVar41) {
                    uVar32 = uVar41;
                  }
                  uVar41 = auVar104._16_8_;
                  if ((long)auVar104._16_8_ < (long)auVar76._16_8_) {
                    uVar41 = auVar76._16_8_;
                  }
                  uVar17 = vpextrq_avx(auVar76._16_16_,1);
                  uVar33 = vpextrq_avx(auVar104._16_16_,1);
                  if ((long)uVar33 < (long)uVar17) {
                    uVar33 = uVar17;
                  }
                  uVar17 = auVar114._0_8_;
                  if ((long)uVar37 <= (long)auVar114._0_8_) {
                    uVar17 = uVar37;
                  }
                  uVar28 = vpextrq_avx(auVar114._0_16_,1);
                  if ((long)uVar32 <= (long)uVar28) {
                    uVar28 = uVar32;
                  }
                  uVar35 = auVar114._16_8_;
                  if ((long)uVar41 <= (long)auVar114._16_8_) {
                    uVar35 = uVar41;
                  }
                  uVar23 = vpextrq_avx(auVar114._16_16_,1);
                  if ((long)uVar33 <= (long)uVar23) {
                    uVar23 = uVar33;
                  }
                  uVar42 = auVar80._0_8_;
                  if ((long)auVar80._0_8_ < (long)auVar56._0_8_) {
                    uVar42 = auVar56._0_8_;
                  }
                  uVar24 = vpextrq_avx(auVar56._0_16_,1);
                  uVar38 = vpextrq_avx(auVar80._0_16_,1);
                  if ((long)uVar38 < (long)uVar24) {
                    uVar38 = uVar24;
                  }
                  uVar24 = auVar80._16_8_;
                  if ((long)auVar80._16_8_ < (long)auVar56._16_8_) {
                    uVar24 = auVar56._16_8_;
                  }
                  uVar47 = vpextrq_avx(auVar56._16_16_,1);
                  uVar46 = vpextrq_avx(auVar80._16_16_,1);
                  if ((long)uVar46 < (long)uVar47) {
                    uVar46 = uVar47;
                  }
                  uVar47 = uVar37;
                  if ((long)uVar37 <= (long)auVar75._0_8_) {
                    uVar47 = auVar75._0_8_;
                  }
                  uVar29 = vpextrq_avx(auVar75._0_16_,1);
                  uVar39 = uVar32;
                  if ((long)uVar32 <= (long)uVar29) {
                    uVar39 = uVar29;
                  }
                  uVar29 = uVar41;
                  if ((long)uVar41 <= (long)auVar75._16_8_) {
                    uVar29 = auVar75._16_8_;
                  }
                  uVar18 = vpextrq_avx(auVar75._16_16_,1);
                  uVar43 = uVar33;
                  if ((long)uVar33 <= (long)uVar18) {
                    uVar43 = uVar18;
                  }
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = uVar32;
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = uVar37;
                  auVar49 = vpunpcklqdq_avx(auVar110,auVar63);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = uVar41;
                  auVar125._8_8_ = 0;
                  auVar125._0_8_ = uVar33;
                  auVar93 = vpunpcklqdq_avx(auVar95,auVar125);
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = uVar35;
                  auVar115._8_8_ = 0;
                  auVar115._0_8_ = uVar23;
                  auVar94 = vpunpcklqdq_avx(auVar50,auVar115);
                  auVar120._8_8_ = 0;
                  auVar120._0_8_ = uVar28;
                  auVar126._8_8_ = 0;
                  auVar126._0_8_ = uVar17;
                  auVar106 = vpunpcklqdq_avx(auVar126,auVar120);
                  auVar127 = ZEXT3264(auVar127._0_32_);
                  auVar114 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar94,
                                                 ZEXT116(0) * auVar94 + ZEXT116(1) * auVar106));
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = uVar46;
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar24;
                  auVar94 = vpunpcklqdq_avx(auVar64,auVar51);
                  auVar65._8_8_ = 0;
                  auVar65._0_8_ = uVar38;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = uVar42;
                  auVar106 = vpunpcklqdq_avx(auVar96,auVar65);
                  auVar56._0_16_ = ZEXT116(0) * auVar94 + ZEXT116(1) * auVar106;
                  auVar56._16_16_ = ZEXT116(1) * auVar94;
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = uVar47;
                  auVar116._8_8_ = 0;
                  auVar116._0_8_ = uVar39;
                  auVar94 = vpunpcklqdq_avx(auVar66,auVar116);
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = uVar29;
                  auVar104._0_16_ = ZEXT116(0) * auVar97 + ZEXT116(1) * auVar94;
                  auVar104._16_16_ = ZEXT116(1) * auVar97;
                  auVar76._8_8_ = uVar43;
                  auVar76._0_8_ = uVar43;
                  auVar76._16_8_ = uVar43;
                  auVar76._24_8_ = uVar43;
                  auVar80 = vpblendd_avx2(auVar104,auVar76,0xc0);
                  *(undefined1 (*) [16])((long)*ptr + lVar36 + 0x10) = auVar93;
                  *(undefined1 (*) [16])((long)*ptr + lVar36) = auVar49;
                  auVar128 = ZEXT3264(auVar128._0_32_);
                  auVar79 = ZEXT3264(auVar78);
                  auVar82 = ZEXT3264(auVar81);
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar36) = auVar80;
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar36) = auVar75;
                  lVar36 = lVar36 + 0x20;
                } while (lVar34 != lVar36);
                auVar57._8_8_ = uVar39;
                auVar57._0_8_ = uVar39;
                auVar57._16_8_ = uVar39;
                auVar57._24_8_ = uVar39;
                auVar62 = vpunpcklqdq_avx2(auVar57,auVar104);
                uVar37 = ptr_00[uVar31 + 1];
                auVar62 = vpblendd_avx2(auVar62,ZEXT832(uVar37),3);
                auVar62 = vpaddq_avx2(auVar62,(undefined1  [32])*ptr_03);
                uVar32 = auVar62._0_8_;
                if ((long)auVar62._0_8_ < (long)uVar42) {
                  uVar32 = uVar42;
                }
                uVar41 = vpextrq_avx(auVar62._0_16_,1);
                if ((long)uVar41 < (long)uVar38) {
                  uVar41 = uVar38;
                }
                uVar33 = auVar62._16_8_;
                if ((long)auVar62._16_8_ < (long)uVar24) {
                  uVar33 = uVar24;
                }
                uVar28 = vpextrq_avx(auVar62._16_16_,1);
                uVar17 = uVar31 + 1;
                if ((long)uVar28 < (long)uVar46) {
                  uVar28 = uVar46;
                }
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar28;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar33;
                auVar49 = vpunpcklqdq_avx(auVar67,auVar52);
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar41;
                auVar83._8_8_ = 0;
                auVar83._0_8_ = uVar32;
                auVar93 = vpunpcklqdq_avx(auVar83,auVar68);
                auVar58._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar93;
                auVar58._16_16_ = ZEXT116(1) * auVar49;
                iVar15 = 1;
                do {
                  auVar62 = vperm2i128_avx2(auVar58,auVar58,8);
                  auVar62 = vpalignr_avx2(auVar58,auVar62,8);
                  auVar62 = vpaddq_avx2(auVar74,auVar62);
                  uVar32 = auVar62._0_8_;
                  if ((long)auVar62._0_8_ < (long)auVar58._0_8_) {
                    uVar32 = auVar58._0_8_;
                  }
                  uVar33 = vpextrq_avx(auVar58._0_16_,1);
                  uVar41 = vpextrq_avx(auVar62._0_16_,1);
                  if ((long)uVar41 < (long)uVar33) {
                    uVar41 = uVar33;
                  }
                  uVar33 = auVar62._16_8_;
                  if ((long)auVar62._16_8_ < (long)auVar58._16_8_) {
                    uVar33 = auVar58._16_8_;
                  }
                  auVar69._8_8_ = 0;
                  auVar69._0_8_ = uVar41;
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = uVar32;
                  auVar49 = vpunpcklqdq_avx(auVar98,auVar69);
                  lVar25 = vpextrq_avx(auVar58._16_16_,1);
                  lVar36 = vpextrq_avx(auVar62._16_16_,1);
                  auVar117._8_8_ = 0;
                  auVar117._0_8_ = uVar33;
                  auVar91._0_16_ = ZEXT116(0) * auVar117 + ZEXT116(1) * auVar49;
                  auVar91._16_16_ = ZEXT116(1) * auVar117;
                  if (lVar36 < lVar25) {
                    lVar36 = lVar25;
                  }
                  auVar59._8_8_ = lVar36;
                  auVar59._0_8_ = lVar36;
                  auVar59._16_8_ = lVar36;
                  auVar59._24_8_ = lVar36;
                  auVar58 = vpblendd_avx2(auVar91,auVar59,0xc0);
                  iVar15 = iVar15 + -1;
                } while (iVar15 == 0);
                auVar53._8_8_ = uVar41;
                auVar53._0_8_ = uVar41;
                auVar60._16_16_ = ZEXT116(1) * auVar53;
                auVar60._0_16_ = ZEXT116(0) * auVar53;
                auVar62 = vpalignr_avx2(auVar91,auVar60,8);
                auVar124 = vpaddq_avx2(auVar62,ZEXT832(uVar40));
                if ((long)uVar37 < (long)auVar124._0_8_) {
                  uVar37 = auVar124._0_8_;
                }
                uVar32 = vpextrq_avx(auVar124._0_16_,1);
                if ((long)uVar47 < (long)uVar32) {
                  uVar47 = uVar32;
                }
                if ((long)uVar39 < (long)auVar124._16_8_) {
                  uVar39 = auVar124._16_8_;
                }
                uVar32 = vpextrq_avx(auVar124._16_16_,1);
                if ((long)uVar29 < (long)uVar32) {
                  uVar29 = uVar32;
                }
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar29;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = uVar39;
                auVar49 = vpunpcklqdq_avx(auVar70,auVar54);
                auVar71._8_8_ = 0;
                auVar71._0_8_ = uVar47;
                auVar84._8_8_ = 0;
                auVar84._0_8_ = uVar37;
                auVar93 = vpunpcklqdq_avx(auVar84,auVar71);
                auVar61._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar93;
                auVar61._16_16_ = ZEXT116(1) * auVar49;
                lVar36 = 0;
                auVar109 = ZEXT3264(auVar109._0_32_);
                auVar10._8_8_ = 0x20;
                auVar10._0_8_ = 0x20;
                auVar10._16_8_ = 0x20;
                auVar10._24_8_ = 0x20;
                auVar9._8_8_ = 4;
                auVar9._0_8_ = 4;
                auVar9._16_8_ = 4;
                auVar9._24_8_ = 4;
                do {
                  auVar122._8_8_ = 0x40;
                  auVar122._0_8_ = 0x40;
                  auVar2._8_8_ = 1;
                  auVar2._0_8_ = 1;
                  auVar2._16_8_ = 1;
                  auVar122._16_8_ = 0x40;
                  auVar2._24_8_ = 1;
                  auVar122._24_8_ = 0x40;
                  piVar6 = ((ppVar16->field_4).rowcols)->score_row;
                  auVar62 = vpsubq_avx2(auVar61,auVar78);
                  auVar80 = vpsubq_avx2(auVar124,auVar81);
                  uVar37 = auVar80._0_8_;
                  if ((long)auVar80._0_8_ < (long)auVar62._0_8_) {
                    uVar37 = auVar62._0_8_;
                  }
                  uVar41 = vpextrq_avx(auVar62._0_16_,1);
                  uVar32 = vpextrq_avx(auVar80._0_16_,1);
                  if ((long)uVar32 < (long)uVar41) {
                    uVar32 = uVar41;
                  }
                  uVar41 = auVar80._16_8_;
                  if ((long)auVar80._16_8_ < (long)auVar62._16_8_) {
                    uVar41 = auVar62._16_8_;
                  }
                  uVar28 = vpextrq_avx(auVar62._16_16_,1);
                  uVar33 = vpextrq_avx(auVar80._16_16_,1);
                  if ((long)uVar33 < (long)uVar28) {
                    uVar33 = uVar28;
                  }
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = uVar33;
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ = uVar41;
                  auVar49 = vpunpcklqdq_avx(auVar99,auVar85);
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = uVar32;
                  auVar118._8_8_ = 0;
                  auVar118._0_8_ = uVar37;
                  auVar93 = vpunpcklqdq_avx(auVar118,auVar100);
                  auVar124._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar93;
                  auVar49 = ZEXT116(1) * auVar49;
                  auVar124._16_16_ = auVar49;
                  auVar62 = vpcmpgtq_avx2(auVar62,auVar80);
                  auVar62 = vblendvpd_avx(auVar122,auVar10,auVar62);
                  uVar28 = *(ulong *)((long)*ptr_01 + lVar36);
                  uVar35 = *(ulong *)((long)*ptr_01 + lVar36 + 8);
                  if ((long)uVar28 <= (long)uVar37) {
                    uVar28 = uVar37;
                  }
                  if ((long)uVar35 <= (long)uVar32) {
                    uVar35 = uVar32;
                  }
                  uVar23 = *(ulong *)((long)*ptr_01 + lVar36 + 0x10);
                  if ((long)uVar23 <= (long)uVar41) {
                    uVar23 = uVar41;
                  }
                  uVar42 = *(ulong *)((long)*ptr_01 + lVar36 + 0x18);
                  if ((long)uVar42 <= (long)uVar33) {
                    uVar42 = uVar33;
                  }
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uVar42;
                  auVar86._8_8_ = 0;
                  auVar86._0_8_ = uVar23;
                  auVar93 = vpunpcklqdq_avx(auVar86,auVar55);
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = uVar35;
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ = uVar28;
                  auVar94 = vpunpcklqdq_avx(auVar101,auVar87);
                  auVar61._0_16_ = ZEXT116(0) * auVar93 + ZEXT116(1) * auVar94;
                  auVar93 = ZEXT116(1) * auVar93;
                  auVar61._16_16_ = auVar93;
                  pauVar1 = (undefined1 (*) [24])((long)*ptr_02 + lVar36);
                  auVar92._0_8_ = -(ulong)(auVar61._0_8_ == *(long *)*pauVar1);
                  auVar92._8_8_ = -(ulong)(auVar61._8_8_ == *(long *)(*pauVar1 + 8));
                  auVar92._16_8_ = -(ulong)(auVar93._0_8_ == SUB248(*pauVar1,0x10));
                  auVar92._24_8_ = -(ulong)(auVar93._8_8_ == *(long *)pauVar1[1]);
                  auVar105._0_8_ = -(ulong)(auVar61._0_8_ == auVar124._0_8_);
                  auVar105._8_8_ = -(ulong)(auVar61._8_8_ == auVar124._8_8_);
                  auVar105._16_8_ = -(ulong)(auVar93._0_8_ == auVar49._0_8_);
                  auVar105._24_8_ = -(ulong)(auVar93._8_8_ == auVar49._8_8_);
                  auVar80 = vpsubq_avx2(auVar2,auVar105);
                  auVar80 = vblendvpd_avx(auVar80,auVar9,auVar92);
                  auVar62 = vorpd_avx(auVar62,*(undefined1 (*) [32])((long)piVar6 + lVar36 + lVar30)
                                     );
                  auVar62 = vorpd_avx(auVar62,auVar80);
                  *(undefined1 (*) [32])((long)piVar6 + lVar36 + lVar30) = auVar62;
                  uVar38 = auVar114._0_8_;
                  if ((long)uVar28 <= (long)auVar114._0_8_) {
                    uVar38 = uVar28;
                  }
                  uVar24 = vpextrq_avx(auVar114._0_16_,1);
                  if ((long)uVar35 <= (long)uVar24) {
                    uVar24 = uVar35;
                  }
                  uVar46 = auVar114._16_8_;
                  if ((long)uVar23 <= (long)auVar114._16_8_) {
                    uVar46 = uVar23;
                  }
                  uVar47 = vpextrq_avx(auVar114._16_16_,1);
                  if ((long)uVar42 <= (long)uVar47) {
                    uVar47 = uVar42;
                  }
                  if ((long)uVar37 <= (long)uVar38) {
                    uVar38 = uVar37;
                  }
                  if ((long)uVar32 <= (long)uVar24) {
                    uVar24 = uVar32;
                  }
                  if ((long)uVar41 <= (long)uVar46) {
                    uVar46 = uVar41;
                  }
                  if ((long)uVar33 <= (long)uVar47) {
                    uVar47 = uVar33;
                  }
                  if ((long)uVar28 < (long)auVar109._0_8_) {
                    uVar28 = auVar109._0_8_;
                  }
                  uVar37 = vpextrq_avx(auVar109._0_16_,1);
                  if ((long)uVar35 < (long)uVar37) {
                    uVar35 = uVar37;
                  }
                  if ((long)uVar23 < (long)auVar109._16_8_) {
                    uVar23 = auVar109._16_8_;
                  }
                  uVar37 = vpextrq_avx(auVar109._16_16_,1);
                  if ((long)uVar42 < (long)uVar37) {
                    uVar42 = uVar37;
                  }
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar47;
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = uVar46;
                  auVar49 = vpunpcklqdq_avx(auVar88,auVar72);
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = uVar24;
                  auVar111._8_8_ = 0;
                  auVar111._0_8_ = uVar38;
                  auVar93 = vpunpcklqdq_avx(auVar111,auVar102);
                  auVar113._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar93;
                  auVar113._16_16_ = ZEXT116(1) * auVar49;
                  auVar114 = ZEXT3264(auVar113);
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar36) = auVar61;
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = uVar42;
                  auVar119._8_8_ = 0;
                  auVar119._0_8_ = uVar23;
                  auVar49 = vpunpcklqdq_avx(auVar119,auVar107);
                  auVar121._8_8_ = 0;
                  auVar121._0_8_ = uVar35;
                  auVar123._8_8_ = 0;
                  auVar123._0_8_ = uVar28;
                  auVar93 = vpunpcklqdq_avx(auVar123,auVar121);
                  auVar108._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar93;
                  auVar108._16_16_ = ZEXT116(1) * auVar49;
                  auVar109 = ZEXT3264(auVar108);
                  lVar36 = lVar36 + 0x20;
                } while (lVar34 != lVar36);
                auVar62 = vpcmpgtq_avx2((undefined1  [32])*palVar22,auVar77._0_32_);
                uVar37 = auVar77._0_8_;
                if ((long)auVar77._0_8_ < (*palVar22)[0]) {
                  uVar37 = (*palVar22)[0];
                }
                uVar32 = vpextrq_avx(auVar77._0_16_,1);
                if ((long)uVar32 < (*palVar22)[1]) {
                  uVar32 = (*palVar22)[1];
                }
                uVar41 = auVar77._16_8_;
                if ((long)auVar77._16_8_ < (*palVar22)[2]) {
                  uVar41 = (*palVar22)[2];
                }
                uVar33 = vpextrq_avx(auVar77._16_16_,1);
                if ((long)uVar33 < (*palVar22)[3]) {
                  uVar33 = (*palVar22)[3];
                }
                auVar73._8_8_ = 0;
                auVar73._0_8_ = uVar33;
                auVar89._8_8_ = 0;
                auVar89._0_8_ = uVar41;
                auVar49 = vpunpcklqdq_avx(auVar89,auVar73);
                auVar90._8_8_ = 0;
                auVar90._0_8_ = uVar32;
                auVar103._8_8_ = 0;
                auVar103._0_8_ = uVar37;
                auVar93 = vpunpcklqdq_avx(auVar103,auVar90);
                auVar94 = ZEXT116(1) * auVar49;
                auVar77 = ZEXT3264(CONCAT1616(auVar94,ZEXT116(0) * auVar49 + ZEXT116(1) * auVar93));
                auVar78._8_8_ = -(ulong)(iVar21 == 2);
                auVar78._0_8_ = -(ulong)(iVar21 == 3);
                auVar78._16_8_ = -(ulong)(iVar21 == 1);
                auVar78._24_8_ = -(ulong)(iVar21 == 0);
                auVar78 = auVar78 & auVar62;
                local_250 = (int)uVar31;
                if ((((auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar78 >> 0x7f,0) != '\0') || SUB321(auVar78 >> 0xbf,0) != '\0') ||
                    auVar78[0x1f] < '\0') {
                  local_2d8 = local_250;
                }
                lVar30 = lVar30 + uVar45 * 0x20;
                uVar31 = uVar17;
              } while (uVar17 != uVar27);
              uVar27 = uVar40;
              if (s2_end != 0) {
                if (iVar14 < 3) {
                  iVar15 = 1;
                  if (1 < iVar21) {
                    iVar15 = iVar21;
                  }
                  do {
                    auVar62 = auVar77._0_32_;
                    auVar74 = vperm2f128_avx(auVar62,auVar62,8);
                    auVar74 = vpalignr_avx2(auVar62,auVar74,8);
                    auVar94 = auVar74._16_16_;
                    auVar77 = ZEXT3264(auVar74);
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
                uVar27 = vpextrq_avx(auVar94,1);
              }
              iVar15 = iVar13;
              if ((s1_end != 0) && (((ulong)uVar3 + 3 & 0x7ffffffc) != 0)) {
                uVar31 = 0;
                uVar45 = uVar27;
                do {
                  iVar19 = ((uint)uVar31 & 3) * a + ((uint)(uVar31 >> 2) & 0x3fffffff);
                  uVar27 = uVar45;
                  iVar11 = iVar15;
                  iVar12 = local_2d8;
                  if ((iVar19 < (int)uVar3) &&
                     (uVar27 = (*ptr_02)[uVar31], iVar11 = iVar19, iVar12 = iVar20,
                     (long)uVar27 <= (long)uVar45)) {
                    if (iVar15 <= iVar19) {
                      iVar19 = iVar15;
                    }
                    if (local_2d8 != iVar20) {
                      iVar19 = iVar15;
                    }
                    bVar48 = uVar27 == uVar45;
                    uVar27 = uVar45;
                    iVar11 = iVar15;
                    iVar12 = local_2d8;
                    if (bVar48) {
                      iVar11 = iVar19;
                    }
                  }
                  local_2d8 = iVar12;
                  iVar15 = iVar11;
                  uVar31 = uVar31 + 1;
                  uVar45 = uVar27;
                } while ((a & 0x1fffffff) << 2 != (int)uVar31);
              }
              iVar19 = (int)uVar27;
              if (s2_end == 0 && s1_end == 0) {
                auVar49 = SUB3216(ptr_02[(uint)(iVar13 % (int)a)],0x10);
                auVar79 = ZEXT3264((undefined1  [32])ptr_02[(uint)(iVar13 % (int)a)]);
                if (iVar14 < 3) {
                  iVar15 = 1;
                  if (1 < iVar21) {
                    iVar15 = iVar21;
                  }
                  do {
                    auVar62 = auVar79._0_32_;
                    auVar74 = vperm2i128_avx2(auVar62,auVar62,8);
                    auVar74 = vpalignr_avx2(auVar62,auVar74,8);
                    auVar49 = auVar74._16_16_;
                    auVar79 = ZEXT3264(auVar74);
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
                uVar44 = vpextrq_avx(auVar49,1);
                iVar19 = (int)uVar44;
                iVar15 = iVar13;
                local_2d8 = iVar20;
              }
              auVar81._8_8_ = uVar40;
              auVar81._0_8_ = uVar40;
              auVar81._16_8_ = uVar40;
              auVar81._24_8_ = uVar40;
              auVar74 = vpcmpgtq_avx2(auVar81,auVar113);
              auVar62 = vpcmpgtq_avx2(auVar108,auVar112);
              auVar74 = vpor_avx2(auVar74,auVar62);
              if ((((auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar74 >> 0x7f,0) != '\0') || SUB321(auVar74 >> 0xbf,0) != '\0') ||
                  auVar74[0x1f] < '\0') {
                *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                iVar19 = 0;
                local_2d8 = 0;
                iVar15 = 0;
              }
              ppVar16->score = iVar19;
              ppVar16->end_query = iVar15;
              ppVar16->end_ref = local_2d8;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar16;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;
    __m256i vTIns;
    __m256i vTDel;
    __m256i vTDiag;
    __m256i vTDiagE;
    __m256i vTInsE;
    __m256i vTDiagF;
    __m256i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));
    vTIns  = _mm256_set1_epi64x_rpl(PARASAIL_INS);
    vTDel  = _mm256_set1_epi64x_rpl(PARASAIL_DEL);
    vTDiag = _mm256_set1_epi64x_rpl(PARASAIL_DIAG);
    vTDiagE= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm256_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF= _mm256_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm256_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 32, sizeof(__m256i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vHt;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vT;
        __m256i vET;
        __m256i vFT;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vET = _mm256_blendv_epi8(vTInsE, vTDiagE, case1);
            arr_store(result->trace->trace_table, vET, i, segLen, j);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vHp = _mm256_add_epi64(vHp, vW);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            _mm256_store_si256(pvH+i, vHp);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        for (i=0; i<segLen; ++i) {
            vET = arr_load(result->trace->trace_table, i, segLen, j);
            vHp = _mm256_load_si256(pvH+i);
            vHt = _mm256_load_si256(pvHt+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFT = _mm256_blendv_epi8(vTDelF, vTDiagF, case1);
            vH = _mm256_max_epi64_rpl(vHt, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vT = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vTIns, vTDel, case2),
                    vTDiag, case1);
            vT = _mm256_or_si256(vT, vET);
            vT = _mm256_or_si256(vT, vFT);
            arr_store(result->trace->trace_table, vT, i, segLen, j);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
        }

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
        }
    } 

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}